

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O1

void __thiscall helics::BrokerApp::BrokerApp(BrokerApp *this,string_view argString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ParseOutput PVar6;
  void *pvVar7;
  undefined4 extraout_var;
  char *__s;
  size_type __n;
  string_view brokerName;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  __s = argString._M_str;
  brokerName._M_str = (char *)argString._M_len;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  if ((brokerName._M_str == (char *)0x0) ||
     (pvVar7 = memchr(__s,0x2d,(size_t)brokerName._M_str),
     (long)pvVar7 - (long)__s == -1 || pvVar7 == (void *)0x0)) {
    brokerName._M_len = (size_t)local_58;
    BrokerFactory::findBroker(brokerName);
    uVar4 = local_58._8_8_;
    uVar3 = local_58._0_8_;
    local_58._0_8_ = (element_type *)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    peVar2 = (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar5 = (*peVar2->_vptr_Broker[0xb])();
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&this->name,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(extraout_var,iVar5));
      return;
    }
  }
  local_70._8_8_ = paVar1;
  local_70._16_8_ = &this->name;
  generateParser((BrokerApp *)local_70,SUB81(this,0));
  uVar3 = local_70._0_8_;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,__s,brokerName._M_str + (long)__s);
  PVar6 = helicsCLI11App::helics_parse<std::__cxx11::string>
                    ((helicsCLI11App *)uVar3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  if (PVar6 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)local_70);
  }
  if ((helicsCLI11App *)local_70._0_8_ != (helicsCLI11App *)0x0) {
    (**(code **)(*(long *)local_70._0_8_ + 8))();
  }
  return;
}

Assistant:

BrokerApp::BrokerApp(std::string_view argString)
{
    if (argString.find_first_of('-') == std::string_view::npos) {
        broker = BrokerFactory::findBroker(argString);
        if (broker) {
            name = broker->getIdentifier();
            return;
        }
    }
    auto app = generateParser();
    if (app->helics_parse(std::string(argString)) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}